

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *window,ImRect *item_rect,ImGuiScrollFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  ImVec2 IVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  byte bVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  undefined4 in_R9D;
  undefined4 uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  ImRect local_30;
  
  IVar19 = (window->InnerRect).Min;
  IVar5 = (window->InnerRect).Max;
  fVar20 = IVar5.x + 1.0;
  fVar21 = IVar5.y + 1.0;
  uVar4 = window->DecoInnerSizeX1;
  uVar6 = window->DecoInnerSizeY1;
  auVar23._0_4_ = IVar19.x + -1.0 + (float)uVar4;
  auVar23._4_4_ = IVar19.y + -1.0 + (float)uVar6;
  auVar23._8_8_ = 0;
  uVar15 = flags;
  if ((flags & 0x15U) == 0) {
    uVar15 = (uint)window->ScrollbarX | flags;
  }
  auVar8._4_4_ = fVar21;
  auVar8._0_4_ = fVar20;
  auVar8._8_8_ = 0;
  auVar23 = minps(auVar23,auVar8);
  if ((uVar15 & 0x2a) == 0) {
    uVar11 = 2;
    if (window->Appearing != false) {
      uVar11 = 0x20;
    }
    uVar15 = uVar15 | uVar11;
  }
  fVar18 = (item_rect->Max).x;
  IVar19 = item_rect->Min;
  fVar22 = auVar23._0_4_;
  fVar24 = auVar23._4_4_;
  fVar17 = IVar19.x;
  fVar16 = IVar19.y;
  auVar7._4_4_ = -(uint)(fVar22 <= fVar17);
  auVar7._0_4_ = -(uint)(fVar22 <= fVar17);
  auVar7._8_4_ = -(uint)(fVar24 <= fVar16);
  auVar7._12_4_ = -(uint)(fVar24 <= fVar16);
  uVar14 = movmskpd(in_R9D,auVar7);
  fVar1 = (item_rect->Max).y;
  fVar2 = (GImGui->Style).ItemSpacing.x;
  bVar9 = 1;
  bVar13 = 1;
  if ((fVar20 - fVar22 < fVar2 + fVar2 + (fVar18 - fVar17)) && (window->AutoFitFramesX < '\x01')) {
    bVar13 = ((byte)window->Flags & 0x40) >> 6;
  }
  bVar12 = fVar18 <= fVar20 & (byte)uVar14;
  fVar3 = (GImGui->Style).ItemSpacing.y;
  if ((fVar21 - fVar24 < fVar3 + fVar3 + (fVar1 - fVar16)) && (window->AutoFitFramesY < '\x01')) {
    bVar9 = ((byte)window->Flags & 0x40) >> 6;
  }
  bVar10 = (byte)uVar14 >> 1 & fVar1 <= fVar21;
  if ((uVar15 & 1) == 0 || bVar12 != 0) {
    if ((((uVar15 & 4) == 0 | bVar12) & (uVar15 & 0x10) == 0) == 0) {
      if (bVar13 == 0) goto LAB_0018a7ae;
      fVar20 = 0.5;
      fVar18 = (float)(int)((fVar17 + fVar18) * 0.5);
LAB_0018a7b1:
      (window->ScrollTarget).x =
           (float)(int)((((fVar18 - (window->Pos).x) - window->DecoOuterSizeX1) - (float)uVar4) +
                       (window->Scroll).x);
      (window->ScrollTargetCenterRatio).x = fVar20;
      (window->ScrollTargetEdgeSnapDist).x = 0.0;
    }
  }
  else {
    if ((fVar22 <= fVar17 & bVar13) == 0) {
      IVar19.x = fVar17 - fVar2;
      IVar19.y = 0.0;
LAB_0018a7ae:
      fVar18 = IVar19.x;
      fVar20 = 0.0;
      goto LAB_0018a7b1;
    }
    if (fVar20 <= fVar18) {
      fVar18 = fVar18 + fVar2;
      fVar20 = 1.0;
      goto LAB_0018a7b1;
    }
  }
  if ((uVar15 & 2) == 0 || bVar10 != 0) {
    if ((((uVar15 & 8) == 0 | bVar10) & (uVar15 & 0x20) == 0) != 0) goto LAB_0018a89a;
    if (bVar9 == 0) goto LAB_0018a856;
    fVar20 = 0.5;
    fVar16 = (float)(int)((fVar16 + fVar1) * 0.5);
  }
  else if ((fVar24 <= fVar16 & bVar9) == 0) {
    fVar16 = fVar16 - fVar3;
LAB_0018a856:
    fVar20 = 0.0;
  }
  else {
    if (fVar1 < fVar21) goto LAB_0018a89a;
    fVar16 = fVar1 + fVar3;
    fVar20 = 1.0;
  }
  (window->ScrollTarget).y =
       (float)(int)((((fVar16 - (window->Pos).y) - window->DecoOuterSizeY1) - (float)uVar6) +
                   (window->Scroll).y);
  (window->ScrollTargetCenterRatio).y = fVar20;
  (window->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_0018a89a:
  IVar19 = CalcNextScrollFromScrollTargetAndClamp(window);
  fVar20 = IVar19.x - (window->Scroll).x;
  fVar21 = IVar19.y - (window->Scroll).y;
  if (((uVar15 & 0x40) == 0) && ((window->Flags & 0x1000000) != 0)) {
    uVar15 = (flags & 0xffffffeaU) + 1;
    if ((flags & 0x14U) == 0) {
      uVar15 = flags;
    }
    uVar11 = uVar15 & 0xffffffc1 | 2;
    if ((uVar15 & 0x28) == 0) {
      uVar11 = uVar15;
    }
    local_30.Min.x = (item_rect->Min).x - fVar20;
    local_30.Min.y = (item_rect->Min).y - fVar21;
    local_30.Max.x = (item_rect->Max).x - fVar20;
    local_30.Max.y = (item_rect->Max).y - fVar21;
    IVar19 = ScrollToRectEx(window->ParentWindow,&local_30,uVar11);
    fVar20 = fVar20 + IVar19.x;
    fVar21 = fVar21 + IVar19.y;
  }
  IVar5.y = fVar21;
  IVar5.x = fVar20;
  return IVar5;
}

Assistant:

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow* window, const ImRect& item_rect, ImGuiScrollFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImRect scroll_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    scroll_rect.Min.x = ImMin(scroll_rect.Min.x + window->DecoInnerSizeX1, scroll_rect.Max.x);
    scroll_rect.Min.y = ImMin(scroll_rect.Min.y + window->DecoInnerSizeY1, scroll_rect.Max.y);
    //GetForegroundDrawList(window)->AddRect(item_rect.Min, item_rect.Max, IM_COL32(255,0,0,255), 0.0f, 0, 5.0f); // [DEBUG]
    //GetForegroundDrawList(window)->AddRect(scroll_rect.Min, scroll_rect.Max, IM_COL32_WHITE); // [DEBUG]

    // Check that only one behavior is selected per axis
    IM_ASSERT((flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_));
    IM_ASSERT((flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_));

    // Defaults
    ImGuiScrollFlags in_flags = flags;
    if ((flags & ImGuiScrollFlags_MaskX_) == 0 && window->ScrollbarX)
        flags |= ImGuiScrollFlags_KeepVisibleEdgeX;
    if ((flags & ImGuiScrollFlags_MaskY_) == 0)
        flags |= window->Appearing ? ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeY;

    const bool fully_visible_x = item_rect.Min.x >= scroll_rect.Min.x && item_rect.Max.x <= scroll_rect.Max.x;
    const bool fully_visible_y = item_rect.Min.y >= scroll_rect.Min.y && item_rect.Max.y <= scroll_rect.Max.y;
    const bool can_be_fully_visible_x = (item_rect.GetWidth() + g.Style.ItemSpacing.x * 2.0f) <= scroll_rect.GetWidth() || (window->AutoFitFramesX > 0) || (window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0;
    const bool can_be_fully_visible_y = (item_rect.GetHeight() + g.Style.ItemSpacing.y * 2.0f) <= scroll_rect.GetHeight() || (window->AutoFitFramesY > 0) || (window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0;

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeX) && !fully_visible_x)
    {
        if (item_rect.Min.x < scroll_rect.Min.x || !can_be_fully_visible_x)
            SetScrollFromPosX(window, item_rect.Min.x - g.Style.ItemSpacing.x - window->Pos.x, 0.0f);
        else if (item_rect.Max.x >= scroll_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x + g.Style.ItemSpacing.x - window->Pos.x, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterX) && !fully_visible_x) || (flags & ImGuiScrollFlags_AlwaysCenterX))
    {
        if (can_be_fully_visible_x)
            SetScrollFromPosX(window, ImTrunc((item_rect.Min.x + item_rect.Max.x) * 0.5f) - window->Pos.x, 0.5f);
        else
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x, 0.0f);
    }

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeY) && !fully_visible_y)
    {
        if (item_rect.Min.y < scroll_rect.Min.y || !can_be_fully_visible_y)
            SetScrollFromPosY(window, item_rect.Min.y - g.Style.ItemSpacing.y - window->Pos.y, 0.0f);
        else if (item_rect.Max.y >= scroll_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y + g.Style.ItemSpacing.y - window->Pos.y, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterY) && !fully_visible_y) || (flags & ImGuiScrollFlags_AlwaysCenterY))
    {
        if (can_be_fully_visible_y)
            SetScrollFromPosY(window, ImTrunc((item_rect.Min.y + item_rect.Max.y) * 0.5f) - window->Pos.y, 0.5f);
        else
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y, 0.0f);
    }

    ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
    ImVec2 delta_scroll = next_scroll - window->Scroll;

    // Also scroll parent window to keep us into view if necessary
    if (!(flags & ImGuiScrollFlags_NoScrollParent) && (window->Flags & ImGuiWindowFlags_ChildWindow))
    {
        // FIXME-SCROLL: May be an option?
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterX | ImGuiScrollFlags_KeepVisibleCenterX)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskX_) | ImGuiScrollFlags_KeepVisibleEdgeX;
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterY | ImGuiScrollFlags_KeepVisibleCenterY)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskY_) | ImGuiScrollFlags_KeepVisibleEdgeY;
        delta_scroll += ScrollToRectEx(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll), in_flags);
    }

    return delta_scroll;
}